

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::OneHotEncoder::MergePartialFromCodedStream
          (OneHotEncoder *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  bool bVar4;
  uint32 uVar5;
  uint uVar6;
  int iVar7;
  unsigned_long uVar8;
  Int64Vector *this_00;
  StringVector *this_01;
  pair<int,_int> pVar9;
  char cVar10;
  ulong uVar11;
  pair<unsigned_long,_bool> pVar12;
  
LAB_004c00c3:
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_004c00e6;
      input->buffer_ = pbVar2 + 1;
      uVar11 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_004c00e6:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar11 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar11 = 0x100000000;
      }
      uVar11 = uVar5 | uVar11;
    }
    uVar5 = (uint32)uVar11;
    if ((uVar11 & 0x100000000) == 0) goto LAB_004c0107;
    uVar6 = (uint)(uVar11 >> 3) & 0x1fffffff;
    cVar10 = (char)uVar11;
    if (uVar6 < 10) {
      if (uVar6 == 1) {
        if (cVar10 != '\n') goto LAB_004c0107;
        if (this->_oneof_case_[0] == 1) {
          this_01 = (this->CategoryType_).stringcategories_;
        }
        else {
          clear_CategoryType(this);
          this->_oneof_case_[0] = 1;
          this_01 = (StringVector *)operator_new(0x30);
          StringVector::StringVector(this_01);
          (this->CategoryType_).stringcategories_ = this_01;
        }
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) && (iVar7 = (int)(char)*puVar3, -1 < iVar7)) {
          input->buffer_ = puVar3 + 1;
        }
        else {
          iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar7 < 0) {
            return false;
          }
        }
        pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                          (input,iVar7);
        if ((long)pVar9 < 0) {
          return false;
        }
        bVar4 = StringVector::MergePartialFromCodedStream(this_01,input);
      }
      else {
        if ((uVar6 != 2) || (cVar10 != '\x12')) goto LAB_004c0107;
        if (this->_oneof_case_[0] == 2) {
          this_00 = (this->CategoryType_).int64categories_;
        }
        else {
          clear_CategoryType(this);
          this->_oneof_case_[0] = 2;
          this_00 = (Int64Vector *)operator_new(0x28);
          Int64Vector::Int64Vector(this_00);
          (this->CategoryType_).int64categories_ = this_00;
        }
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) && (iVar7 = (int)(char)*puVar3, -1 < iVar7)) {
          input->buffer_ = puVar3 + 1;
        }
        else {
          iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar7 < 0) {
            return false;
          }
        }
        pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                          (input,iVar7);
        if ((long)pVar9 < 0) {
          return false;
        }
        bVar4 = Int64Vector::MergePartialFromCodedStream(this_00,input);
      }
      if (bVar4 == false) {
        return false;
      }
      bVar4 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                        (input,pVar9.first);
    }
    else {
      if (uVar6 == 10) {
        if (cVar10 == 'P') {
          puVar3 = input->buffer_;
          if ((puVar3 < input->buffer_end_) &&
             (uVar8 = (unsigned_long)(char)*puVar3, -1 < (long)uVar8)) {
            input->buffer_ = puVar3 + 1;
          }
          else {
            pVar12 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
            uVar8 = pVar12.first;
            if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              return false;
            }
          }
          this->outputsparse_ = uVar8 != 0;
          goto LAB_004c00c3;
        }
      }
      else if ((uVar6 == 0xb) && (cVar10 == 'X')) {
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar11 = (ulong)bVar1;
          uVar5 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_004c02e4;
          input->buffer_ = pbVar2 + 1;
        }
        else {
          uVar5 = 0;
LAB_004c02e4:
          uVar11 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
          if ((long)uVar11 < 0) {
            return false;
          }
        }
        this->handleunknown_ = (int)uVar11;
        goto LAB_004c00c3;
      }
LAB_004c0107:
      if (uVar5 == 0) {
        return true;
      }
      if ((uVar5 & 7) == 4) {
        return true;
      }
      bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5);
    }
    if (bVar4 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool OneHotEncoder::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.OneHotEncoder)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.StringVector stringCategories = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_stringcategories()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64Vector int64Categories = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_int64categories()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool outputSparse = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &outputsparse_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.OneHotEncoder.HandleUnknown handleUnknown = 11;
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(88u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_handleunknown(static_cast< ::CoreML::Specification::OneHotEncoder_HandleUnknown >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.OneHotEncoder)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.OneHotEncoder)
  return false;
#undef DO_
}